

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

bool __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare::operator()
          (StringOffsetCompare *this,Offset<flatbuffers::String> *a,Offset<flatbuffers::String> *b)

{
  bool bVar1;
  uint a_size;
  uint b_size;
  Vector<char,_unsigned_int> *this_00;
  Vector<char,_unsigned_int> *this_01;
  char *a_data;
  char *b_data;
  String *strb;
  String *stra;
  Offset<flatbuffers::String> *b_local;
  Offset<flatbuffers::String> *a_local;
  StringOffsetCompare *this_local;
  
  this_00 = (Vector<char,_unsigned_int> *)
            vector_downward<unsigned_int>::data_at(this->buf_,(ulong)a->o);
  this_01 = (Vector<char,_unsigned_int> *)
            vector_downward<unsigned_int>::data_at(this->buf_,(ulong)b->o);
  a_data = Vector<char,_unsigned_int>::data(this_00);
  a_size = Vector<char,_unsigned_int>::size(this_00);
  b_data = Vector<char,_unsigned_int>::data(this_01);
  b_size = Vector<char,_unsigned_int>::size(this_01);
  bVar1 = StringLessThan(a_data,a_size,b_data,b_size);
  return bVar1;
}

Assistant:

bool operator()(const Offset<String> &a, const Offset<String> &b) const {
      auto stra = reinterpret_cast<const String *>(buf_->data_at(a.o));
      auto strb = reinterpret_cast<const String *>(buf_->data_at(b.o));
      return StringLessThan(stra->data(), stra->size(), strb->data(),
                            strb->size());
    }